

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

Instr * __thiscall FlowGraph::PeepTypedCm(FlowGraph *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  OpCode OVar5;
  BranchInstr *this_00;
  BranchInstr *this_01;
  BranchInstr *this_02;
  RegOpnd *opnd;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  Instr *pIVar8;
  IntConstOpnd *pIVar9;
  Func *pFVar10;
  IntConstType value;
  Func **ppFVar11;
  IntConstType value_00;
  BranchInstr *this_03;
  Opnd *pOVar12;
  IntConstType value_01;
  RegOpnd *local_50;
  
  this_00 = (BranchInstr *)IR::Instr::GetNextRealInstrOrLabel(instr);
  OVar1 = (this_00->super_Instr).m_opcode;
  if (OVar1 == Ld_I4) {
    this_01 = (BranchInstr *)IR::Instr::GetNextRealInstrOrLabel((Instr *)this_00);
    OVar1 = (this_01->super_Instr).m_opcode;
    if (OVar1 != Ld_I4) goto LAB_00412f06;
    this_02 = (BranchInstr *)IR::Instr::GetNextRealInstrOrLabel((Instr *)this_01);
    OVar1 = (this_02->super_Instr).m_opcode;
    this_03 = this_01;
  }
  else {
    this_01 = this_00;
    this_00 = (BranchInstr *)0x0;
LAB_00412f06:
    this_03 = (BranchInstr *)0x0;
    this_02 = this_01;
  }
  if ((OVar1 & ~ExtendedOpcodePrefix) != BrTrue_I4) {
    return (Instr *)0x0;
  }
  if (this_03 == (BranchInstr *)0x0 || this_00 != (BranchInstr *)0x0) {
    if ((this_00 != (BranchInstr *)0x0) &&
       (bVar3 = IR::Opnd::IsEqual((this_00->super_Instr).m_src1,instr->m_dst), !bVar3)) {
      return (Instr *)0x0;
    }
    if (this_03 != (BranchInstr *)0x0) goto LAB_00412faa;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x9cb,"(instrLd || (!instrLd && !instrLd2))",
                       "Either instrLd is non-null or both null");
    if (!bVar3) goto LAB_004138a5;
    *puVar6 = 0;
LAB_00412faa:
    bVar3 = IR::Opnd::IsEqual((this_03->super_Instr).m_src1,(this_00->super_Instr).m_dst);
    if (!bVar3) {
      return (Instr *)0x0;
    }
  }
  bVar3 = IR::Opnd::IsEqual(instr->m_dst,(this_02->super_Instr).m_src1);
  if (((!bVar3) &&
      ((this_00 == (BranchInstr *)0x0 ||
       (bVar3 = IR::Opnd::IsEqual((this_00->super_Instr).m_dst,(this_02->super_Instr).m_src1),
       !bVar3)))) &&
     ((this_03 == (BranchInstr *)0x0 ||
      (bVar3 = IR::Opnd::IsEqual((this_03->super_Instr).m_dst,(this_02->super_Instr).m_src1), !bVar3
      )))) {
    return (Instr *)0x0;
  }
  local_50 = (RegOpnd *)IR::Instr::UnlinkSrc1(instr);
  opnd = (RegOpnd *)IR::Instr::UnlinkSrc2(instr);
  bVar3 = IR::Opnd::IsEqual(instr->m_dst,(Opnd *)local_50);
  if (((bVar3) ||
      ((this_00 != (BranchInstr *)0x0 &&
       (bVar3 = IR::Opnd::IsEqual((this_00->super_Instr).m_dst,(Opnd *)local_50), bVar3)))) ||
     ((this_03 != (BranchInstr *)0x0 &&
      (bVar3 = IR::Opnd::IsEqual((this_03->super_Instr).m_dst,(Opnd *)local_50), bVar3)))) {
    if ((local_50->super_Opnd).m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x9ea,"(src1->IsInt32())","src1->IsInt32()");
      if (!bVar3) goto LAB_004138a5;
      *puVar6 = 0;
    }
    pRVar7 = IR::RegOpnd::New(TyInt32,instr->m_func);
    pIVar8 = IR::Instr::New(Ld_I4,&pRVar7->super_Opnd,(Opnd *)local_50,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar8,instr);
    IR::Instr::InsertBefore(instr,pIVar8);
    local_50 = pRVar7;
  }
  bVar3 = IR::Opnd::IsEqual(instr->m_dst,(Opnd *)opnd);
  if (((bVar3) ||
      ((this_00 != (BranchInstr *)0x0 &&
       (bVar3 = IR::Opnd::IsEqual((this_00->super_Instr).m_dst,(Opnd *)opnd), bVar3)))) ||
     ((pRVar7 = opnd, this_03 != (BranchInstr *)0x0 &&
      (bVar3 = IR::Opnd::IsEqual((this_03->super_Instr).m_dst,(Opnd *)opnd), bVar3)))) {
    if ((opnd->super_Opnd).m_type != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x9f5,"(src2->IsInt32())","src2->IsInt32()");
      if (!bVar3) goto LAB_004138a5;
      *puVar6 = 0;
    }
    pRVar7 = IR::RegOpnd::New(TyInt32,instr->m_func);
    pIVar8 = IR::Instr::New(Ld_I4,&pRVar7->super_Opnd,(Opnd *)opnd,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar8,instr);
    IR::Instr::InsertBefore(instr,pIVar8);
  }
  IR::Instr::ReplaceSrc1(&this_02->super_Instr,&local_50->super_Opnd);
  if ((this_02->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_004138a5;
    *puVar6 = 0;
  }
  pFVar10 = (this_02->super_Instr).m_func;
  if ((pRVar7->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_004138a5;
    *puVar6 = 0;
  }
  bVar4 = (pRVar7->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    pRVar7 = (RegOpnd *)IR::Opnd::Copy(&pRVar7->super_Opnd,pFVar10);
    bVar4 = (pRVar7->super_Opnd).field_0xb;
  }
  (pRVar7->super_Opnd).field_0xb = bVar4 | 2;
  (this_02->super_Instr).m_src2 = &pRVar7->super_Opnd;
  switch(instr->m_opcode) {
  case CmUnGe_A:
    OVar5 = BrUnGe_A;
    break;
  case CmUnGt_A:
    OVar5 = BrUnGt_A;
    break;
  case CmUnLt_A:
    OVar5 = BrUnLt_A;
    break;
  case CmUnLe_A:
    OVar5 = BrUnLe_A;
    break;
  case CmEq_I4:
    OVar5 = BrEq_I4;
    break;
  case CmNeq_I4:
    OVar5 = BrNeq_I4;
    break;
  case CmLt_I4:
    OVar5 = BrLt_I4;
    break;
  case CmLe_I4:
    OVar5 = BrLe_I4;
    break;
  case CmGt_I4:
    OVar5 = BrGt_I4;
    break;
  case CmGe_I4:
    OVar5 = BrGe_I4;
    break;
  case CmUnLt_I4:
    OVar5 = BrUnLt_I4;
    break;
  case CmUnLe_I4:
    OVar5 = BrUnLe_I4;
    break;
  case CmUnGt_I4:
    OVar5 = BrUnGt_I4;
    break;
  case CmUnGe_I4:
    OVar5 = BrUnGe_I4;
    break;
  default:
    switch(instr->m_opcode) {
    case CmEq_A:
      OVar5 = BrEq_A;
      break;
    case CmGe_A:
      OVar5 = BrGe_A;
      break;
    case CmGt_A:
      OVar5 = BrGt_A;
      break;
    case CmLt_A:
      OVar5 = BrLt_A;
      break;
    case CmLe_A:
      OVar5 = BrLe_A;
      break;
    case CmNeq_A:
      OVar5 = BrNeq_A;
      break;
    case CmSrEq_A:
      OVar5 = BrSrEq_A;
      break;
    case CmSrNeq_A:
      OVar5 = BrSrNeq_A;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xa48,"((0))","(0)");
      if (!bVar3) goto LAB_004138a5;
      *puVar6 = 0;
      OVar5 = InvalidOpCode;
    }
  }
  (this_02->super_Instr).m_opcode = OVar5;
  if (OVar1 == BrTrue_I4) {
    pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
    if (instr->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004138a5;
      *puVar6 = 0;
    }
    ppFVar11 = &instr->m_func;
    pFVar10 = *ppFVar11;
    if ((pIVar9->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_004138a5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    bVar4 = (pIVar9->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      pIVar9 = (IntConstOpnd *)IR::Opnd::Copy(&pIVar9->super_Opnd,pFVar10);
      bVar4 = (pIVar9->super_Opnd).field_0xb;
    }
    (pIVar9->super_Opnd).field_0xb = bVar4 | 2;
    instr->m_src1 = &pIVar9->super_Opnd;
    instr->m_opcode = Ld_I4;
    pOVar12 = instr->m_dst;
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
    pIVar8 = IR::Instr::New(Ld_I4,pOVar12,&pIVar9->super_Opnd,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar8,&this_02->super_Instr);
    IR::Instr::InsertAfter(&this_02->super_Instr,pIVar8);
    if (this_00 == (BranchInstr *)0x0) {
      return &this_02->super_Instr;
    }
    value_00 = 1;
    value_01 = 0;
    pIVar9 = IR::IntConstOpnd::New(1,TyInt8,*ppFVar11,false);
    IR::Instr::ReplaceSrc1(&this_00->super_Instr,&pIVar9->super_Opnd);
    pOVar12 = (this_00->super_Instr).m_dst;
    pFVar10 = *ppFVar11;
    value = 0;
  }
  else {
    if ((this_02->super_Instr).m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar3) goto LAB_004138a5;
      *puVar6 = 0;
    }
    IR::BranchInstr::Invert(this_02);
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,instr->m_func,false);
    if (instr->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_004138a5;
      *puVar6 = 0;
    }
    ppFVar11 = &instr->m_func;
    pFVar10 = *ppFVar11;
    if ((pIVar9->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) goto LAB_004138a5;
      *puVar6 = 0;
    }
    bVar4 = (pIVar9->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      pIVar9 = (IntConstOpnd *)IR::Opnd::Copy(&pIVar9->super_Opnd,pFVar10);
      bVar4 = (pIVar9->super_Opnd).field_0xb;
    }
    (pIVar9->super_Opnd).field_0xb = bVar4 | 2;
    instr->m_src1 = &pIVar9->super_Opnd;
    instr->m_opcode = Ld_I4;
    pOVar12 = instr->m_dst;
    value_01 = 1;
    pIVar9 = IR::IntConstOpnd::New(1,TyInt8,instr->m_func,false);
    pIVar8 = IR::Instr::New(Ld_I4,pOVar12,&pIVar9->super_Opnd,instr->m_func);
    IR::Instr::SetByteCodeOffset(pIVar8,&this_02->super_Instr);
    IR::Instr::InsertAfter(&this_02->super_Instr,pIVar8);
    if (this_00 == (BranchInstr *)0x0) {
      return &this_02->super_Instr;
    }
    value_00 = 0;
    pIVar9 = IR::IntConstOpnd::New(0,TyInt8,*ppFVar11,false);
    IR::Instr::ReplaceSrc1(&this_00->super_Instr,&pIVar9->super_Opnd);
    pOVar12 = (this_00->super_Instr).m_dst;
    pFVar10 = *ppFVar11;
    value = 1;
  }
  ppFVar11 = &instr->m_func;
  pIVar9 = IR::IntConstOpnd::New(value,TyInt8,pFVar10,false);
  pIVar8 = IR::Instr::New(Ld_I4,pOVar12,&pIVar9->super_Opnd,*ppFVar11);
  IR::Instr::SetByteCodeOffset(pIVar8,&this_02->super_Instr);
  IR::Instr::InsertAfter(&this_02->super_Instr,pIVar8);
  if (this_03 != (BranchInstr *)0x0) {
    pIVar9 = IR::IntConstOpnd::New(value_00,TyInt8,*ppFVar11,false);
    IR::Instr::ReplaceSrc1(&this_03->super_Instr,&pIVar9->super_Opnd);
    pOVar12 = (this_03->super_Instr).m_dst;
    pIVar9 = IR::IntConstOpnd::New(value_01,TyInt8,*ppFVar11,false);
    pIVar8 = IR::Instr::New(Ld_I4,pOVar12,&pIVar9->super_Opnd,*ppFVar11);
    IR::Instr::SetByteCodeOffset(pIVar8,&this_02->super_Instr);
    IR::Instr::InsertAfter(&this_02->super_Instr,pIVar8);
    return &this_02->super_Instr;
  }
  return &this_02->super_Instr;
}

Assistant:

IR::Instr *
FlowGraph::PeepTypedCm(IR::Instr *instr)
{
    // Basic pattern, peep:
    //      t1 = CmEq a, b
    //      BrTrue_I4 $L1, t1
    // Into:
    //      t1 = 1
    //      BrEq $L1, a, b
    //      t1 = 0

    IR::Instr * instrNext = instr->GetNextRealInstrOrLabel();

    // find intermediate Lds
    IR::Instr * instrLd = nullptr;
    if (instrNext->m_opcode == Js::OpCode::Ld_I4)
    {
        instrLd = instrNext;
        instrNext = instrNext->GetNextRealInstrOrLabel();
    }

    IR::Instr * instrLd2 = nullptr;
    if (instrNext->m_opcode == Js::OpCode::Ld_I4)
    {
        instrLd2 = instrNext;
        instrNext = instrNext->GetNextRealInstrOrLabel();
    }

    // Find BrTrue/BrFalse
    IR::Instr *instrBr;
    bool brIsTrue;
    if (instrNext->m_opcode == Js::OpCode::BrTrue_I4)
    {
        instrBr = instrNext;
        brIsTrue = true;
    }
    else if (instrNext->m_opcode == Js::OpCode::BrFalse_I4)
    {
        instrBr = instrNext;
        brIsTrue = false;
    }
    else
    {
        return nullptr;
    }

    AssertMsg(instrLd || (!instrLd && !instrLd2), "Either instrLd is non-null or both null");

    // if we have intermediate Lds, then make sure pattern is:
    //      t1 = CmEq a, b
    //      t2 = Ld_A t1
    //      BrTrue $L1, t2
    if (instrLd && !instrLd->GetSrc1()->IsEqual(instr->GetDst()))
    {
        return nullptr;
    }

    if (instrLd2 && !instrLd2->GetSrc1()->IsEqual(instrLd->GetDst()))
    {
        return nullptr;
    }

    // Make sure we have:
    //      t1 = CmEq a, b
    //           BrTrue/BrFalse t1
    if (!(instr->GetDst()->IsEqual(instrBr->GetSrc1()) || (instrLd && instrLd->GetDst()->IsEqual(instrBr->GetSrc1())) || (instrLd2 && instrLd2->GetDst()->IsEqual(instrBr->GetSrc1()))))
    {
        return nullptr;
    }

    IR::Opnd * src1 = instr->UnlinkSrc1();
    IR::Opnd * src2 = instr->UnlinkSrc2();

    IR::Instr * instrNew;
    IR::Opnd * tmpOpnd;
    if (instr->GetDst()->IsEqual(src1) || (instrLd && instrLd->GetDst()->IsEqual(src1)) || (instrLd2 && instrLd2->GetDst()->IsEqual(src1)))
    {
        Assert(src1->IsInt32());

        tmpOpnd = IR::RegOpnd::New(TyInt32, instr->m_func);
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, tmpOpnd, src1, instr->m_func);
        instrNew->SetByteCodeOffset(instr);
        instr->InsertBefore(instrNew);
        src1 = tmpOpnd;
    }

    if (instr->GetDst()->IsEqual(src2) || (instrLd && instrLd->GetDst()->IsEqual(src2)) || (instrLd2 && instrLd2->GetDst()->IsEqual(src2)))
    {
        Assert(src2->IsInt32());

        tmpOpnd = IR::RegOpnd::New(TyInt32, instr->m_func);
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, tmpOpnd, src2, instr->m_func);
        instrNew->SetByteCodeOffset(instr);
        instr->InsertBefore(instrNew);
        src2 = tmpOpnd;
    }

    instrBr->ReplaceSrc1(src1);
    instrBr->SetSrc2(src2);

    Js::OpCode newOpcode;
    switch (instr->m_opcode)
    {
    case Js::OpCode::CmEq_I4:
        newOpcode = Js::OpCode::BrEq_I4;
        break;
    case Js::OpCode::CmGe_I4:
        newOpcode = Js::OpCode::BrGe_I4;
        break;
    case Js::OpCode::CmGt_I4:
        newOpcode = Js::OpCode::BrGt_I4;
        break;
    case Js::OpCode::CmLt_I4:
        newOpcode = Js::OpCode::BrLt_I4;
        break;
    case Js::OpCode::CmLe_I4:
        newOpcode = Js::OpCode::BrLe_I4;
        break;
    case Js::OpCode::CmUnGe_I4:
        newOpcode = Js::OpCode::BrUnGe_I4;
        break;
    case Js::OpCode::CmUnGt_I4:
        newOpcode = Js::OpCode::BrUnGt_I4;
        break;
    case Js::OpCode::CmUnLt_I4:
        newOpcode = Js::OpCode::BrUnLt_I4;
        break;
    case Js::OpCode::CmUnLe_I4:
        newOpcode = Js::OpCode::BrUnLe_I4;
        break;
    case Js::OpCode::CmNeq_I4:
        newOpcode = Js::OpCode::BrNeq_I4;
        break;
    case Js::OpCode::CmEq_A:
        newOpcode = Js::OpCode::BrEq_A;
        break;
    case Js::OpCode::CmGe_A:
        newOpcode = Js::OpCode::BrGe_A;
        break;
    case Js::OpCode::CmGt_A:
        newOpcode = Js::OpCode::BrGt_A;
        break;
    case Js::OpCode::CmLt_A:
        newOpcode = Js::OpCode::BrLt_A;
        break;
    case Js::OpCode::CmLe_A:
        newOpcode = Js::OpCode::BrLe_A;
        break;
    case Js::OpCode::CmUnGe_A:
        newOpcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::CmUnGt_A:
        newOpcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmUnLt_A:
        newOpcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::CmUnLe_A:
        newOpcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::CmNeq_A:
        newOpcode = Js::OpCode::BrNeq_A;
        break;
    case Js::OpCode::CmSrEq_A:
        newOpcode = Js::OpCode::BrSrEq_A;
        break;
    case Js::OpCode::CmSrNeq_A:
        newOpcode = Js::OpCode::BrSrNeq_A;
        break;
    default:
        newOpcode = Js::OpCode::InvalidOpCode;
        Assume(UNREACHED);
    }

    instrBr->m_opcode = newOpcode;

    if (brIsTrue)
    {
        instr->SetSrc1(IR::IntConstOpnd::New(1, TyInt8, instr->m_func));
        instr->m_opcode = Js::OpCode::Ld_I4;
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instr->GetDst(), IR::IntConstOpnd::New(0, TyInt8, instr->m_func), instr->m_func);
        instrNew->SetByteCodeOffset(instrBr);
        instrBr->InsertAfter(instrNew);
        if (instrLd)
        {
            instrLd->ReplaceSrc1(IR::IntConstOpnd::New(1, TyInt8, instr->m_func));
            instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd->GetDst(), IR::IntConstOpnd::New(0, TyInt8, instr->m_func), instr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrBr->InsertAfter(instrNew);

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(IR::IntConstOpnd::New(1, TyInt8, instr->m_func));
                instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd2->GetDst(), IR::IntConstOpnd::New(0, TyInt8, instr->m_func), instr->m_func);
                instrNew->SetByteCodeOffset(instrBr);
                instrBr->InsertAfter(instrNew);
            }
        }
    }
    else
    {
        instrBr->AsBranchInstr()->Invert();

        instr->SetSrc1(IR::IntConstOpnd::New(0, TyInt8, instr->m_func));
        instr->m_opcode = Js::OpCode::Ld_I4;
        instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instr->GetDst(), IR::IntConstOpnd::New(1, TyInt8, instr->m_func), instr->m_func);
        instrNew->SetByteCodeOffset(instrBr);
        instrBr->InsertAfter(instrNew);
        if (instrLd)
        {
            instrLd->ReplaceSrc1(IR::IntConstOpnd::New(0, TyInt8, instr->m_func));
            instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd->GetDst(), IR::IntConstOpnd::New(1, TyInt8, instr->m_func), instr->m_func);
            instrNew->SetByteCodeOffset(instrBr);
            instrBr->InsertAfter(instrNew);

            if (instrLd2)
            {
                instrLd2->ReplaceSrc1(IR::IntConstOpnd::New(0, TyInt8, instr->m_func));
                instrNew = IR::Instr::New(Js::OpCode::Ld_I4, instrLd2->GetDst(), IR::IntConstOpnd::New(1, TyInt8, instr->m_func), instr->m_func);
                instrNew->SetByteCodeOffset(instrBr);
                instrBr->InsertAfter(instrNew);
            }
        }
    }

    return instrBr;
}